

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O3

void __thiscall
slang::analysis::DataFlowAnalysis::handleTiming(DataFlowAnalysis *this,TimingControl *timing)

{
  NonProceduralExprVisitor visitor;
  NonProceduralExprVisitor local_10;
  
  if (timing->kind != Invalid) {
    local_10.context = this->context;
    local_10.containingSymbol =
         (this->
         super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
         ).super_FlowAnalysisBase.rootSymbol;
    ast::TimingControl::visit<slang::analysis::NonProceduralExprVisitor>(timing,&local_10);
    return;
  }
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  super_FlowAnalysisBase.bad = true;
  return;
}

Assistant:

bool bad() const { return kind == TimingControlKind::Invalid; }